

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
::operator()(void)

{
  value_type vVar1;
  value_type vVar2;
  unsigned_long d0;
  unsigned_long in_stack_00000010;
  unsigned_long in_stack_00000018;
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL> local_28;
  
  vVar1 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>
                    ((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)&stack0x00000008,1);
  local_28.dynamic_dims_._M_elems[2] = in_stack_00000018;
  local_28.dynamic_dims_._M_elems[0] = d0;
  local_28.dynamic_dims_._M_elems[1] = in_stack_00000010;
  vVar2 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>(&local_28,2);
  return vVar2 * vVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Reduction()(
            Op()(d0[Idx], d1[Idx], d2[Idx])
          , dims_ternary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0), std::move(d1), std::move(d2))
        );
    }